

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O1

MetadataPointer __thiscall
duckdb::MetadataManager::FromDiskPointer(MetadataManager *this,MetaBlockPointer pointer)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  InternalException *this_00;
  ulong uVar3;
  MetadataPointer params_2;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  _Hash_node_base *params;
  string local_48;
  
  params_2 = (MetadataPointer)pointer.block_pointer;
  params = (_Hash_node_base *)((ulong)params_2 & 0xffffffffffffff);
  uVar1 = (this->blocks)._M_h._M_bucket_count;
  uVar3 = (ulong)params % uVar1;
  p_Var4 = (this->blocks)._M_h._M_buckets[uVar3];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var4->_M_nxt, p_Var5 = p_Var4, params != p_Var4->_M_nxt[1]._M_nxt)) {
    while (p_Var4 = p_Var2, p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var5 = p_Var4, params == p_Var2[1]._M_nxt)) goto LAB_005b7120;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_005b7120:
  if ((p_Var5 != (__node_base_ptr)0x0) && (p_Var5->_M_nxt != (_Hash_node_base *)0x0)) {
    return params_2;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Failed to load metadata pointer (id %llu, idx %llu, ptr %llu)\n",
             "");
  InternalException::InternalException<long,unsigned_int,unsigned_long>
            (this_00,&local_48,(long)params,(uint)pointer.block_pointer._7_1_,
             (unsigned_long)params_2);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

MetadataPointer MetadataManager::FromDiskPointer(MetaBlockPointer pointer) {
	auto block_id = pointer.GetBlockId();
	auto index = pointer.GetBlockIndex();
	auto entry = blocks.find(block_id);
	if (entry == blocks.end()) { // LCOV_EXCL_START
		throw InternalException("Failed to load metadata pointer (id %llu, idx %llu, ptr %llu)\n", block_id, index,
		                        pointer.block_pointer);
	} // LCOV_EXCL_STOP
	MetadataPointer result;
	result.block_index = UnsafeNumericCast<idx_t>(block_id);
	result.index = UnsafeNumericCast<uint8_t>(index);
	return result;
}